

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiKeyRoutingData * ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)

{
  int *piVar1;
  ImVector<ImGuiKeyRoutingData> *pIVar2;
  int iVar3;
  ImGuiKeyRoutingData *pIVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  undefined8 in_RAX;
  ImGuiKeyRoutingData *pIVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  short sVar12;
  int iVar13;
  ImGuiContext *ctx;
  ImGuiKeyRoutingData *pIVar14;
  undefined2 local_33;
  undefined1 local_31;
  
  pIVar5 = GImGui;
  uVar10 = key_chord & 0xf000;
  uVar8 = key_chord & 0xffff0fffU;
  if ((((key_chord & 0xffff0fffU) == 0) && (uVar8 = uVar10, key_chord - 0x1000U < 0x8000)) &&
     (uVar11 = key_chord - 0x1000U >> 0xc, (0x8bU >> (uVar11 & 0x1f) & 1) != 0)) {
    uVar8 = *(uint *)(&DAT_00259ec0 + (ulong)uVar11 * 4);
  }
  pIVar14 = (ImGuiKeyRoutingData *)
            (&GImGui->KeysOwnerData[0x36].LockThisFrame + (long)(int)uVar8 * 2);
  pIVar7 = pIVar14;
  do {
    lVar9 = (long)pIVar7->NextEntryIndex;
    if (lVar9 == -1) {
      iVar3 = (GImGui->KeysRoutingTable).Entries.Size;
      if (iVar3 == (GImGui->KeysRoutingTable).Entries.Capacity) {
        if (iVar3 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar3 / 2 + iVar3;
        }
        iVar13 = iVar3 + 1;
        if (iVar3 + 1 < iVar6) {
          iVar13 = iVar6;
        }
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
        pIVar7 = (ImGuiKeyRoutingData *)
                 (*GImAllocatorAllocFunc)((long)iVar13 << 4,GImAllocatorUserData);
        pIVar4 = (pIVar5->KeysRoutingTable).Entries.Data;
        if (pIVar4 != (ImGuiKeyRoutingData *)0x0) {
          memcpy(pIVar7,pIVar4,(long)(pIVar5->KeysRoutingTable).Entries.Size << 4);
          pIVar4 = (pIVar5->KeysRoutingTable).Entries.Data;
          if ((pIVar4 != (ImGuiKeyRoutingData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        (pIVar5->KeysRoutingTable).Entries.Data = pIVar7;
        (pIVar5->KeysRoutingTable).Entries.Capacity = iVar13;
        iVar6 = (pIVar5->KeysRoutingTable).Entries.Size;
      }
      else {
        pIVar7 = (GImGui->KeysRoutingTable).Entries.Data;
        iVar6 = iVar3;
      }
      pIVar7[iVar6].NextEntryIndex = -1;
      pIVar7[iVar6].Mods = 0;
      pIVar7[iVar6].RoutingNextScore = 0xff;
      local_33 = (undefined2)((ulong)in_RAX >> 0x28);
      *(undefined2 *)&pIVar7[iVar6].field_0x5 = local_33;
      local_31 = (undefined1)((ulong)in_RAX >> 0x38);
      pIVar7[iVar6].field_0x7 = local_31;
      pIVar7[iVar6].RoutingCurr = 0xffffffff;
      pIVar7[iVar6].RoutingNext = 0xffffffff;
      pIVar2 = &(pIVar5->KeysRoutingTable).Entries;
      pIVar2->Size = pIVar2->Size + 1;
      pIVar7 = (pIVar5->KeysRoutingTable).Entries.Data;
      sVar12 = (short)iVar3;
      pIVar7[sVar12].Mods = (ImU16)uVar10;
      pIVar7[sVar12].NextEntryIndex = pIVar14->NextEntryIndex;
      pIVar14->NextEntryIndex = sVar12;
      return pIVar7 + sVar12;
    }
    pIVar4 = (GImGui->KeysRoutingTable).Entries.Data;
    pIVar7 = pIVar4 + lVar9;
  } while (uVar10 != pIVar4[lVar9].Mods);
  return pIVar7;
}

Assistant:

ImGuiKeyRoutingData* ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)
{
    // Majority of shortcuts will be Key + any number of Mods
    // We accept _Single_ mod with ImGuiKey_None.
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl);                    // Legal
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl | ImGuiMod_Shift);   // Legal
    //  - Shortcut(ImGuiMod_Ctrl);                                 // Legal
    //  - Shortcut(ImGuiMod_Ctrl | ImGuiMod_Shift);                // Not legal
    ImGuiContext& g = *GImGui;
    ImGuiKeyRoutingTable* rt = &g.KeysRoutingTable;
    ImGuiKeyRoutingData* routing_data;
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    ImGuiKey mods = (ImGuiKey)(key_chord & ImGuiMod_Mask_);
    if (key == ImGuiKey_None)
        key = ConvertSingleModFlagToKey(mods);
    IM_ASSERT(IsNamedKey(key));

    // Get (in the majority of case, the linked list will have one element so this should be 2 reads.
    // Subsequent elements will be contiguous in memory as list is sorted/rebuilt in NewFrame).
    for (ImGuiKeyRoutingIndex idx = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; idx != -1; idx = routing_data->NextEntryIndex)
    {
        routing_data = &rt->Entries[idx];
        if (routing_data->Mods == mods)
            return routing_data;
    }

    // Add to linked-list
    ImGuiKeyRoutingIndex routing_data_idx = (ImGuiKeyRoutingIndex)rt->Entries.Size;
    rt->Entries.push_back(ImGuiKeyRoutingData());
    routing_data = &rt->Entries[routing_data_idx];
    routing_data->Mods = (ImU16)mods;
    routing_data->NextEntryIndex = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; // Setup linked list
    rt->Index[key - ImGuiKey_NamedKey_BEGIN] = routing_data_idx;
    return routing_data;
}